

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# unittest_lite.pb.cc
# Opt level: O1

uint8_t * __thiscall
proto2_unittest::TestOneofParsingLite::_InternalSerialize
          (TestOneofParsingLite *this,uint8_t *target,EpsCopyOutputStream *stream)

{
  void *data;
  bool bVar1;
  uint uVar2;
  uint8_t *puVar3;
  ulong uVar4;
  char *pcVar5;
  ulong uVar6;
  Cord *s;
  size_t sVar7;
  int32_t value;
  uint32_t uVar8;
  byte *pbVar9;
  undefined8 *puVar10;
  string_view s_00;
  
  uVar8 = (this->field_0)._impl_._oneof_case_[0];
  switch(uVar8) {
  case 1:
    value = 0;
    if (uVar8 == 1) {
      value = *(int32_t *)&this->field_0;
    }
    target = google::protobuf::internal::WireFormatLite::WriteInt32ToArrayWithField<1>
                       (stream,value,target);
    goto switchD_001e3a6e_default;
  case 2:
    target = google::protobuf::internal::WireFormatLite::InternalWriteMessage
                       (2,*(MessageLite **)&this->field_0,
                        (int)(*(MessageLite **)&this->field_0)[1]._internal_metadata_.ptr_,target,
                        stream);
    goto switchD_001e3a6e_default;
  case 3:
    if (uVar8 == 3) {
      puVar10 = (undefined8 *)
                ((ulong)(this->field_0)._impl_.oneof_field_.oneof_submessage_ & 0xfffffffffffffffc);
    }
    else {
      puVar10 = &google::protobuf::internal::fixed_address_empty_string;
    }
    pcVar5 = (char *)*puVar10;
    sVar7 = puVar10[1];
    uVar8 = 3;
    break;
  case 4:
    puVar10 = (undefined8 *)
              ((ulong)(this->field_0)._impl_.oneof_field_.oneof_submessage_ & 0xfffffffffffffffc);
    pcVar5 = (char *)*puVar10;
    sVar7 = puVar10[1];
    uVar8 = 4;
    break;
  case 5:
    puVar10 = (undefined8 *)
              ((ulong)(this->field_0)._impl_.oneof_field_.oneof_submessage_ & 0xfffffffffffffffc);
    pcVar5 = (char *)*puVar10;
    sVar7 = puVar10[1];
    uVar8 = 5;
    break;
  case 6:
    if (uVar8 == 6) {
      s = (this->field_0)._impl_.oneof_field_.oneof_bytes_cord_;
    }
    else {
      s = (Cord *)&google::protobuf::internal::empty_cord_;
    }
    target = google::protobuf::io::EpsCopyOutputStream::WriteBytes<absl::lts_20250127::Cord>
                       (stream,6,s,target);
    goto switchD_001e3a6e_default;
  case 7:
    if (uVar8 == 7) {
      puVar10 = (undefined8 *)
                ((ulong)(this->field_0)._impl_.oneof_field_.oneof_submessage_ & 0xfffffffffffffffc);
    }
    else {
      puVar10 = &google::protobuf::internal::fixed_address_empty_string;
    }
    pcVar5 = (char *)*puVar10;
    sVar7 = puVar10[1];
    uVar8 = 7;
    break;
  case 8:
    puVar10 = (undefined8 *)
              ((ulong)(this->field_0)._impl_.oneof_field_.oneof_submessage_ & 0xfffffffffffffffc);
    pcVar5 = (char *)*puVar10;
    sVar7 = puVar10[1];
    uVar8 = 8;
    break;
  case 9:
    if (stream->end_ <= target) {
      target = google::protobuf::io::EpsCopyOutputStream::EnsureSpaceFallback(stream,target);
    }
    uVar2 = 1;
    if ((this->field_0)._impl_._oneof_case_[0] == 9) {
      uVar2 = *(uint *)&this->field_0;
    }
    *target = 'H';
    pbVar9 = target + 1;
    uVar4 = (ulong)(int)uVar2;
    uVar6 = uVar4;
    if (0x7f < uVar2) {
      do {
        *pbVar9 = (byte)uVar6 | 0x80;
        uVar4 = uVar6 >> 7;
        pbVar9 = pbVar9 + 1;
        bVar1 = 0x3fff < uVar6;
        uVar6 = uVar4;
      } while (bVar1);
    }
    *pbVar9 = (byte)uVar4;
    target = pbVar9 + 1;
  default:
    goto switchD_001e3a6e_default;
  }
  s_00._M_str = pcVar5;
  s_00._M_len = sVar7;
  target = google::protobuf::io::EpsCopyOutputStream::WriteStringMaybeAliased
                     (stream,uVar8,s_00,target);
switchD_001e3a6e_default:
  uVar6 = (this->super_MessageLite)._internal_metadata_.ptr_;
  if ((uVar6 & 1) != 0) {
    data = *(void **)((uVar6 & 0xfffffffffffffffe) + 8);
    uVar6 = (this->super_MessageLite)._internal_metadata_.ptr_;
    if ((uVar6 & 1) == 0) {
      puVar10 = &google::protobuf::internal::fixed_address_empty_string;
      if ((google::protobuf::internal::init_protobuf_defaults_state & 1) == 0) {
        google::protobuf::internal::InitProtobufDefaultsSlow();
      }
    }
    else {
      puVar10 = (undefined8 *)((uVar6 & 0xfffffffffffffffe) + 8);
    }
    uVar2 = *(uint *)(puVar10 + 1);
    if ((long)stream->end_ - (long)target < (long)(int)uVar2) {
      puVar3 = google::protobuf::io::EpsCopyOutputStream::WriteRawFallback(stream,data,uVar2,target)
      ;
      return puVar3;
    }
    memcpy(target,data,(ulong)uVar2);
    target = target + (int)uVar2;
  }
  return target;
}

Assistant:

::uint8_t* PROTOBUF_NONNULL TestOneofParsingLite::_InternalSerialize(
    ::uint8_t* PROTOBUF_NONNULL target,
    ::google::protobuf::io::EpsCopyOutputStream* PROTOBUF_NONNULL stream) const {
  const TestOneofParsingLite& this_ = *this;
#endif  // PROTOBUF_CUSTOM_VTABLE
  // @@protoc_insertion_point(serialize_to_array_start:proto2_unittest.TestOneofParsingLite)
  ::uint32_t cached_has_bits = 0;
  (void)cached_has_bits;

  switch (this_.oneof_field_case()) {
    case kOneofInt32: {
      target =
          ::google::protobuf::internal::WireFormatLite::WriteInt32ToArrayWithField<1>(
              stream, this_._internal_oneof_int32(), target);
      break;
    }
    case kOneofSubmessage: {
      target = ::google::protobuf::internal::WireFormatLite::InternalWriteMessage(
          2, *this_._impl_.oneof_field_.oneof_submessage_, this_._impl_.oneof_field_.oneof_submessage_->GetCachedSize(), target,
          stream);
      break;
    }
    case kOneofString: {
      const ::std::string& _s = this_._internal_oneof_string();
      target = stream->WriteStringMaybeAliased(3, _s, target);
      break;
    }
    case kOneofBytes: {
      const ::std::string& _s = this_._internal_oneof_bytes();
      target = stream->WriteBytesMaybeAliased(4, _s, target);
      break;
    }
    case kOneofStringCord: {
      const ::std::string& _s = this_._internal_oneof_string_cord();
      target = stream->WriteStringMaybeAliased(5, _s, target);
      break;
    }
    case kOneofBytesCord: {
      target = stream->WriteBytes(6, this_._internal_oneof_bytes_cord(), target);
      break;
    }
    case kOneofStringStringPiece: {
      const ::std::string& _s = this_._internal_oneof_string_string_piece();
      target = stream->WriteStringMaybeAliased(7, _s, target);
      break;
    }
    case kOneofBytesStringPiece: {
      const ::std::string& _s = this_._internal_oneof_bytes_string_piece();
      target = stream->WriteBytesMaybeAliased(8, _s, target);
      break;
    }
    case kOneofEnum: {
      target = stream->EnsureSpace(target);
      target = ::_pbi::WireFormatLite::WriteEnumToArray(
          9, this_._internal_oneof_enum(), target);
      break;
    }
    default:
      break;
  }
  if (ABSL_PREDICT_FALSE(this_._internal_metadata_.have_unknown_fields())) {
    target = stream->WriteRaw(
        this_._internal_metadata_.unknown_fields<std::string>(::google::protobuf::internal::GetEmptyString).data(),
        static_cast<int>(this_._internal_metadata_.unknown_fields<std::string>(::google::protobuf::internal::GetEmptyString).size()), target);
  }
  // @@protoc_insertion_point(serialize_to_array_end:proto2_unittest.TestOneofParsingLite)
  return target;
}